

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexSeparableFilter::applyToCorner
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f,int eid)

{
  byte bVar1;
  uint faceid_00;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  int cedgeId [10];
  int cfaceId [10];
  FaceInfo *cface [10];
  PtexSeparableKernel kc;
  FaceInfo *f_00;
  
  bVar1 = f->flags;
  uVar7 = 0;
  f_00 = f;
  uVar5 = faceid;
  iVar6 = eid;
  do {
    bVar4 = bVar1 & 8;
    if (uVar7 == 10) {
LAB_0011c9b4:
      fVar8 = PtexSeparableKernel::weight(k);
      fVar8 = this->_weight - fVar8;
LAB_0011c9ec:
      this->_weight = fVar8;
      return;
    }
    faceid_00 = f_00->adjfaces[iVar6];
    uVar2 = f_00->adjedges >> ((char)iVar6 * '\x02' & 0x1fU) & 3;
    iVar6 = uVar2 + 1;
    if (uVar2 == 3) {
      iVar6 = 0;
    }
    if (((int)faceid_00 < 0) || ((faceid_00 == faceid && (iVar6 == eid)))) {
      iVar6 = (int)uVar7;
      if (iVar6 == 3) {
        applyToCornerFace(this,k,f,eid,cfaceId[1],cface[1],cedgeId[1]);
        return;
      }
      if (3 < uVar7) {
        PtexSeparableKernel::rotate(k,eid + 2);
        fVar8 = PtexSeparableKernel::weight(k);
        fVar9 = PtexSeparableKernel::makeSymmetric(k,fVar8);
        for (uVar7 = 1; iVar6 - 1 != uVar7; uVar7 = uVar7 + 1) {
          PtexSeparableKernel::PtexSeparableKernel(&kc,k);
          applyToCornerFace(this,&kc,f,2,cfaceId[uVar7],cface[uVar7],cedgeId[uVar7]);
        }
        fVar8 = (fVar9 * (float)(iVar6 + -2) - fVar8) + this->_weight;
        goto LAB_0011c9ec;
      }
      goto LAB_0011c9b4;
    }
    iVar3 = (*this->_tx->_vptr_PtexTexture[0x10])(this->_tx,(ulong)faceid_00);
    f_00 = (FaceInfo *)CONCAT44(extraout_var,iVar3);
    cfaceId[uVar7] = faceid_00;
    cedgeId[uVar7] = iVar6;
    cface[uVar7] = f_00;
    bVar1 = f_00->flags;
    if ((((bVar1 & 8) == 0) && (bVar4 != 0)) && (f_00->adjfaces[iVar6 - 1U & 3] == uVar5)) {
      PtexSeparableKernel::adjustSubfaceToMain(k,eid + (uint)(uVar7 == 1) * 2);
      PtexSeparableKernel::rotate(k,((eid - (uint)(uVar7 == 1)) - iVar6) + 3);
      splitAndApply(this,k,faceid_00,f_00);
      return;
    }
    uVar7 = uVar7 + 1;
    uVar5 = faceid_00;
  } while( true );
}

Assistant:

void PtexSeparableFilter::applyToCorner(PtexSeparableKernel& k, int faceid,
                                        const Ptex::FaceInfo& f, int eid)
{
    // traverse clockwise around corner vertex and gather corner faces
    int afid = faceid, aeid = eid;
    const FaceInfo* af = &f;
    bool prevIsSubface = af->isSubface();

    const int MaxValence = 10;
    int cfaceId[MaxValence];
    int cedgeId[MaxValence];
    const FaceInfo* cface[MaxValence];

    int numCorners = 0;
    for (int i = 0; i < MaxValence; i++) {
        // advance to next face
        int prevFace = afid;
        afid = af->adjface(aeid);
        aeid = (af->adjedge(aeid) + 1) % 4;

        // we hit a boundary or reached starting face
        // note: we need to check edge id too because we might have
        // a periodic texture (w/ toroidal topology) where all 4 corners
        // are from the same face
        if (afid < 0 || (afid == faceid && aeid == eid)) {
            numCorners = i - 2;
            break;
        }

        // record face info
        af = &_tx->getFaceInfo(afid);
        cfaceId[i] = afid;
        cedgeId[i] = aeid;
        cface[i] = af;

        // check to see if corner is a subface "tee"
        bool isSubface = af->isSubface();
        if (prevIsSubface && !isSubface && af->adjface((aeid+3)%4) == prevFace)
        {
            // adjust the eid depending on whether we started from
            // the primary or secondary subface.
            bool primary = (i==1);
            k.adjustSubfaceToMain(eid + primary * 2);
            k.rotate(eid - aeid + 3 - primary);
            splitAndApply(k, afid, *af);
            return;
        }
        prevIsSubface = isSubface;
    }

    if (numCorners == 1) {
        // regular case (valence 4)
        applyToCornerFace(k, f, eid, cfaceId[1], *cface[1], cedgeId[1]);
    }
    else if (numCorners > 1) {
        // valence 5+, make kernel symmetric and apply equally to each face
        // first, rotate to standard orientation, u=v=0
        k.rotate(eid + 2);
        float initialWeight = k.weight();
        float newWeight = k.makeSymmetric(initialWeight);
        for (int i = 1; i <= numCorners; i++) {
            PtexSeparableKernel kc = k;
            applyToCornerFace(kc, f, 2, cfaceId[i], *cface[i], cedgeId[i]);
        }
        // adjust weight for symmetrification and for additional corners
        _weight += newWeight * (float)numCorners - initialWeight;
    }
    else {
        // valence 2 or 3, ignore corner face (just adjust weight)
        _weight -= k.weight();
    }
}